

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmprocdemo.c
# Opt level: O0

int main(void)

{
  uint rate;
  float *in_stack_00000008;
  xm_context_t *in_stack_00000010;
  undefined8 local_8;
  
  local_8 = 48000;
  snd_pcm_open(&device,"default",0);
  snd_pcm_hw_params_malloc(&params);
  snd_pcm_hw_params_any(device,params);
  snd_pcm_hw_params_set_access(device,params,3);
  snd_pcm_hw_params_set_format(device,params,0xe);
  snd_pcm_hw_params_set_channels(device,params,2);
  snd_pcm_hw_params_set_rate_near(device,params,&local_8,0);
  snd_pcm_hw_params(device,params);
  xm_create_context_from_libxmize(&ctx,mus,(uint32_t)local_8);
  gen_waveforms();
  snd_pcm_prepare(device);
  do {
    xm_generate_samples(in_stack_00000010,in_stack_00000008,_rate);
    snd_pcm_writei(device,buffer,0x800);
  } while( true );
}

Assistant:

int main(void) {
	unsigned int rate = 48000;

	snd_pcm_open(&device, "default", SND_PCM_STREAM_PLAYBACK, 0);
	snd_pcm_hw_params_malloc(&params);
	snd_pcm_hw_params_any(device, params);
	snd_pcm_hw_params_set_access(device, params, SND_PCM_ACCESS_RW_INTERLEAVED);
	snd_pcm_hw_params_set_format(device, params, SND_PCM_FORMAT_FLOAT);
	snd_pcm_hw_params_set_channels(device, params, 2);
	snd_pcm_hw_params_set_rate_near(device, params, &rate, NULL);
	snd_pcm_hw_params(device, params);

	xm_create_context_from_libxmize(&ctx, mus, rate);
	gen_waveforms();

	snd_pcm_prepare(device);

	while(1) {
		xm_generate_samples(ctx, buffer, 2048);
		snd_pcm_writei(device, buffer, 2048);
	}

	return 0;
}